

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-graphics.cpp
# Opt level: O0

Graphics * __thiscall
Game::Graphics::GameEndScreenOverlay_abi_cxx11_(Graphics *this,end_screen_display_data_t *esdd)

{
  __tuple_element_t<0UL,_tuple<bool,_bool>_> _Var1;
  __tuple_element_t<1UL,_tuple<bool,_bool>_> _Var2;
  __tuple_element_t<0UL,_tuple<bool,_bool>_> *p_Var3;
  __tuple_element_t<1UL,_tuple<bool,_bool>_> *p_Var4;
  ostringstream local_198 [7];
  anon_class_1_1_e6245afc standardWinLosePrompt;
  ostringstream str_os;
  __tuple_element_t<1UL,_tuple<bool,_bool>_> is_endless_mode;
  __tuple_element_t<0UL,_tuple<bool,_bool>_> did_win;
  end_screen_display_data_t *esdd_local;
  
  p_Var3 = std::get<0ul,bool,bool>(esdd);
  _Var1 = *p_Var3;
  p_Var4 = std::get<1ul,bool,bool>(esdd);
  _Var2 = *p_Var4;
  std::__cxx11::ostringstream::ostringstream(local_198);
  DrawOnlyWhen<Game::Graphics::GameEndScreenOverlay[abi:cxx11](std::tuple<bool,bool>)::__0>
            ((ostream *)local_198,(bool)(~(_Var2 & 1U) & 1),(anon_class_1_1_e6245afc)(_Var1 & 1));
  DrawOnlyWhen<std::__cxx11::string(*)()>
            ((ostream *)local_198,(bool)(_Var2 & 1U),EndOfEndlessPrompt_abi_cxx11_);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return this;
}

Assistant:

std::string GameEndScreenOverlay(end_screen_display_data_t esdd) {
  enum EndScreenDisplayDataFields {
    IDX_FLAG_WIN,
    IDX_FLAG_ENDLESS_MODE,
    MAX_ENDSCREENDISPLAYDATA_INDEXES
  };
  const auto did_win = std::get<IDX_FLAG_WIN>(esdd);
  const auto is_endless_mode = std::get<IDX_FLAG_ENDLESS_MODE>(esdd);

  std::ostringstream str_os;
  const auto standardWinLosePrompt = [=] {
    std::ostringstream str_os;
    DrawOnlyWhen(str_os, did_win, YouWinPrompt);
    // else..
    DrawOnlyWhen(str_os, !did_win, GameOverPrompt);
    return str_os.str();
  };
  DrawOnlyWhen(str_os, !is_endless_mode, standardWinLosePrompt);
  // else..
  DrawOnlyWhen(str_os, is_endless_mode, EndOfEndlessPrompt);
  return str_os.str();
}